

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::PhraseTests_RemoveIndices_Test::TestBody(PhraseTests_RemoveIndices_Test *this)

{
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_d0;
  Message local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_2;
  Message local_a0;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_78;
  Message local_70;
  size_type local_68;
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  Indices is;
  Span s;
  PhraseTests_RemoveIndices_Test *this_local;
  
  is.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_2_ = 0;
  is.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_2_ = 3;
  Span::indices((Indices *)local_30,
                (Span *)((long)&is.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4));
  removeIndices((Indices *)local_30,(Span)0x10000);
  local_5c = 2;
  local_68 = std::vector<short,_std::allocator<short>_>::size
                       ((vector<short,_std::allocator<short>_> *)local_30);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_58,"2","is.size()",&local_5c,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_94 = 1;
    pvVar3 = std::vector<short,_std::allocator<short>_>::front
                       ((vector<short,_std::allocator<short>_> *)local_30);
    testing::internal::EqHelper<false>::Compare<int,short>
              ((EqHelper<false> *)local_90,"1","is.front()",&local_94,pvVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x6b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    local_bc = 2;
    pvVar3 = std::vector<short,_std::allocator<short>_>::back
                       ((vector<short,_std::allocator<short>_> *)local_30);
    testing::internal::EqHelper<false>::Compare<int,short>
              ((EqHelper<false> *)local_b8,"2","is.back()",&local_bc,pvVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
                 ,0x6c,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
  std::vector<short,_std::allocator<short>_>::~vector
            ((vector<short,_std::allocator<short>_> *)local_30);
  return;
}

Assistant:

TEST(PhraseTests, RemoveIndices) {
  Span s{0, 3};
  auto is = s.indices();
  removeIndices(is, {0, 1});
  ASSERT_EQ(2, is.size());
  EXPECT_EQ(1, is.front());
  EXPECT_EQ(2, is.back());
}